

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O2

void DumpTables(Float *frequencies,Float *expFrequencies,int thetaRes,int phiRes,char *filename)

{
  ulong uVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ofstream f;
  
  std::ofstream::ofstream((ostream *)&f,filename,_S_out);
  std::operator<<((ostream *)&f,"frequencies = [ ");
  lVar3 = (long)phiRes;
  uVar5 = 0;
  uVar6 = (ulong)(uint)(~(phiRes >> 0x1f) & phiRes);
  uVar1 = (ulong)(uint)(~(thetaRes >> 0x1f) & thetaRes);
  while (uVar5 != uVar1) {
    for (lVar4 = 1; lVar4 - uVar6 != 1; lVar4 = lVar4 + 1) {
      std::ostream::operator<<((ostream *)&f,frequencies[lVar4 + -1]);
      if (lVar4 < lVar3) {
        std::operator<<((ostream *)&f,", ");
      }
    }
    uVar5 = uVar5 + 1;
    if ((long)uVar5 < (long)thetaRes) {
      std::operator<<((ostream *)&f,"; ");
    }
    frequencies = frequencies + lVar3;
  }
  poVar2 = std::operator<<((ostream *)&f," ];");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<(poVar2,"expFrequencies = [ ");
  uVar5 = 0;
  while (uVar5 != uVar1) {
    for (lVar4 = 1; lVar4 - uVar6 != 1; lVar4 = lVar4 + 1) {
      std::ostream::operator<<((ostream *)&f,expFrequencies[lVar4 + -1]);
      if (lVar4 < lVar3) {
        std::operator<<((ostream *)&f,", ");
      }
    }
    uVar5 = uVar5 + 1;
    if ((long)uVar5 < (long)thetaRes) {
      std::operator<<((ostream *)&f,"; ");
    }
    expFrequencies = expFrequencies + lVar3;
  }
  poVar2 = std::operator<<((ostream *)&f," ];");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"colormap(jet);");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"clf; subplot(2,1,1);");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"imagesc(frequencies);");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"title(\'Observed frequencies\');");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"axis equal;");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"subplot(2,1,2);");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"imagesc(expFrequencies);");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"axis equal;");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"title(\'Expected frequencies\');");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ofstream::close();
  std::ofstream::~ofstream(&f);
  return;
}

Assistant:

void DumpTables(const Float* frequencies, const Float* expFrequencies, int thetaRes,
                int phiRes, const char* filename) {
    std::ofstream f(filename);

    f << "frequencies = [ ";
    for (int i = 0; i < thetaRes; ++i) {
        for (int j = 0; j < phiRes; ++j) {
            f << frequencies[i * phiRes + j];
            if (j + 1 < phiRes)
                f << ", ";
        }
        if (i + 1 < thetaRes)
            f << "; ";
    }
    f << " ];" << std::endl << "expFrequencies = [ ";
    for (int i = 0; i < thetaRes; ++i) {
        for (int j = 0; j < phiRes; ++j) {
            f << expFrequencies[i * phiRes + j];
            if (j + 1 < phiRes)
                f << ", ";
        }
        if (i + 1 < thetaRes)
            f << "; ";
    }
    f << " ];" << std::endl
      << "colormap(jet);" << std::endl
      << "clf; subplot(2,1,1);" << std::endl
      << "imagesc(frequencies);" << std::endl
      << "title('Observed frequencies');" << std::endl
      << "axis equal;" << std::endl
      << "subplot(2,1,2);" << std::endl
      << "imagesc(expFrequencies);" << std::endl
      << "axis equal;" << std::endl
      << "title('Expected frequencies');" << std::endl;
    f.close();
}